

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O3

BlurNode * __thiscall
rengine::AllocationPool<rengine::BlurNode>::allocate(AllocationPool<rengine::BlurNode> *this)

{
  Node **ppNVar1;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  **ppvVar2;
  uint uVar3;
  BlurNode *pBVar4;
  uint *puVar5;
  
  uVar3 = this->m_nextFree;
  if (this->m_poolSize <= uVar3) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,
                  "T *rengine::AllocationPool<rengine::BlurNode>::allocate() [T = rengine::BlurNode]"
                 );
  }
  pBVar4 = this->m_memory;
  if (pBVar4 == (BlurNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,
                  "T *rengine::AllocationPool<rengine::BlurNode>::allocate() [T = rengine::BlurNode]"
                 );
  }
  puVar5 = this->m_free;
  if (puVar5 == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,
                  "T *rengine::AllocationPool<rengine::BlurNode>::allocate() [T = rengine::BlurNode]"
                 );
  }
  if (puVar5[uVar3] < this->m_poolSize) {
    this->m_nextFree = uVar3 + 1;
    uVar3 = puVar5[uVar3];
    ppNVar1 = &pBVar4[uVar3].super_Node.m_child;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    ppvVar2 = &pBVar4[uVar3].super_Node.super_SignalEmitter.m_buckets;
    *ppvVar2 = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                *)0x0;
    ppvVar2[1] = (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                  *)0x0;
    pBVar4[uVar3].super_Node.m_prev = (Node *)0x0;
    *(uint *)&pBVar4[uVar3].super_Node.field_0x30 =
         *(uint *)&pBVar4[uVar3].super_Node.field_0x30 & 0xfffff800 | 4;
    pBVar4[uVar3].super_Node.super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Node_001459c0;
    *(undefined4 *)&pBVar4[uVar3].super_Node.field_0x34 = 3;
    return pBVar4 + uVar3;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,
                "T *rengine::AllocationPool<rengine::BlurNode>::allocate() [T = rengine::BlurNode]")
  ;
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }